

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

Vector3 __thiscall xatlas::internal::Mesh::computeFaceNormal(Mesh *this,uint32_t face)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint uVar7;
  ulong uVar8;
  char *__function;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vector3 VVar16;
  
  uVar7 = face * 3;
  uVar3 = (this->m_indices).m_base.size;
  if (uVar7 < uVar3) {
    puVar5 = (this->m_indices).m_base.buffer;
    uVar4 = (this->m_positions).m_base.size;
    if (*(uint *)(puVar5 + (ulong)uVar7 * 4) < uVar4) {
      if (uVar3 <= uVar7 + 1) goto LAB_001b0e0c;
      if (*(uint *)(puVar5 + (ulong)(uVar7 + 1) * 4) < uVar4) {
        if (uVar3 <= uVar7 + 2) goto LAB_001b0e0c;
        uVar8 = (ulong)*(uint *)(puVar5 + (ulong)(uVar7 + 2) * 4);
        if (*(uint *)(puVar5 + (ulong)(uVar7 + 2) * 4) < uVar4) {
          puVar6 = (this->m_positions).m_base.buffer;
          pfVar1 = (float *)(puVar6 + (ulong)*(uint *)(puVar5 + (ulong)uVar7 * 4) * 0xc);
          pfVar2 = (float *)(puVar6 + (ulong)*(uint *)(puVar5 + (ulong)(uVar7 + 1) * 4) * 0xc);
          fVar9 = *(float *)(puVar6 + uVar8 * 0xc) - *pfVar1;
          fVar13 = *(float *)(puVar6 + uVar8 * 0xc + 4) - pfVar1[1];
          fVar15 = *(float *)(puVar6 + uVar8 * 0xc + 8) - pfVar1[2];
          fVar12 = *pfVar2 - *pfVar1;
          fVar10 = pfVar2[1] - pfVar1[1];
          fVar11 = pfVar2[2] - pfVar1[2];
          fVar14 = fVar13 * fVar11 - fVar10 * fVar15;
          fVar11 = fVar15 * fVar12 - fVar11 * fVar9;
          fVar10 = fVar10 * fVar9 - fVar12 * fVar13;
          fVar9 = fVar10 * fVar10 + fVar14 * fVar14 + fVar11 * fVar11;
          if (fVar9 < 0.0) {
            fVar9 = sqrtf(fVar9);
          }
          else {
            fVar9 = SQRT(fVar9);
          }
          if ((fVar9 != 0.0) || (NAN(fVar9))) {
            fVar9 = 1.0 / fVar9;
            fVar14 = fVar14 * fVar9;
            fVar11 = fVar11 * fVar9;
            fVar10 = fVar10 * fVar9;
          }
          else {
            fVar10 = 1.0;
            fVar14 = 0.0;
            fVar11 = 0.0;
          }
          VVar16.y = fVar11;
          VVar16.x = fVar14;
          VVar16.z = fVar10;
          return VVar16;
        }
      }
    }
    __function = 
    "const T &xatlas::internal::Array<xatlas::internal::Vector3>::operator[](uint32_t) const [T = xatlas::internal::Vector3]"
    ;
  }
  else {
LAB_001b0e0c:
    __function = 
    "const T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) const [T = unsigned int]";
  }
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                ,0x4a8,__function);
}

Assistant:

Vector3 computeFaceNormal(uint32_t face) const
	{
		const Vector3 &p0 = m_positions[m_indices[face * 3 + 0]];
		const Vector3 &p1 = m_positions[m_indices[face * 3 + 1]];
		const Vector3 &p2 = m_positions[m_indices[face * 3 + 2]];
		const Vector3 e0 = p2 - p0;
		const Vector3 e1 = p1 - p0;
		const Vector3 normalAreaScaled = cross(e0, e1);
		return normalizeSafe(normalAreaScaled, Vector3(0, 0, 1), 0.0f);
	}